

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicMinCase::verify
          (ShaderAtomicMinCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  deUint32 needle;
  Precision precision;
  ShaderAtomicMinCase *pSVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  uint value;
  ulong uVar6;
  int iVar7;
  int in_stack_00000008;
  deUint32 outputValue;
  long in_stack_00000010;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> outValues;
  set<int,_std::less<int>,_std::allocator<int>_> inValues;
  deInt32 inputValue;
  int local_270;
  deUint32 local_26c;
  Hex<8UL> local_268;
  uint local_25c;
  undefined8 local_258;
  ShaderAtomicMinCase *local_250;
  ulong local_248;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  ulong local_230;
  ulong local_228;
  size_t local_220;
  size_t local_218;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_210;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_25c = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
              (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
              (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  local_228 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)local_25c;
  if ((int)local_228 < 1) {
    uVar4 = (uint)CONCAT71((uint7)(local_228 >> 8) & 0xffffff,1);
  }
  else {
    local_228 = local_228 & 0xffffffff;
    local_230 = (ulong)local_25c;
    local_23c = local_25c * (int)sig;
    local_240 = local_25c * (int)tbs;
    local_270 = 0;
    iVar7 = 0;
    local_248 = 0;
    local_258 = 0;
    local_250 = this;
    local_220 = tbslen;
    local_218 = siglen;
    do {
      uVar4 = *(uint *)(in_stack_00000010 + (int)local_248 * in_stack_00000008);
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e0._M_impl.super__Rb_tree_header._M_header;
      local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_210._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_210._M_impl.super__Rb_tree_header._M_header;
      local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
      value = (this->super_ShaderAtomicOpCase).m_initialValue;
      uVar6 = local_230;
      local_238 = iVar7;
      local_210._M_impl.super__Rb_tree_header._M_header._M_right =
           local_210._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < (int)local_25c) {
        do {
          local_1b0._0_4_ = *(undefined4 *)(local_218 + (long)iVar7);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_1e0,(int *)local_1b0);
          if ((int)local_1b0._0_4_ < (int)value) {
            value = local_1b0._0_4_;
          }
          iVar7 = iVar7 + (int)sig;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      pSVar2 = local_250;
      bVar3 = intEqualsAfterUintCast(value,uVar4,(local_250->super_ShaderAtomicOpCase).m_precision);
      if (!bVar3) {
        local_1b0._0_8_ =
             ((pSVar2->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,(int)local_248);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,": expected minimum ",0x13);
        std::ostream::operator<<(poVar1,value);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        local_268.value = (deUint64)value;
        tcu::Format::Hex<8UL>::toStream(&local_268,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        local_268.value = (ulong)uVar4;
        tcu::Format::Hex<8UL>::toStream(&local_268,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        uVar5 = std::ios_base::~ios_base(local_138);
        local_258 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      if (0 < (int)local_25c) {
        uVar6 = 0;
        iVar7 = local_270;
        do {
          pSVar2 = local_250;
          needle = *(deUint32 *)(local_220 + (long)iVar7);
          precision = (local_250->super_ShaderAtomicOpCase).m_precision;
          local_26c = needle;
          local_234 = iVar7;
          bVar3 = containsAfterUintCast
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1e0,needle,
                             precision);
          if (!bVar3) {
            bVar3 = intEqualsAfterUintCast
                              ((pSVar2->super_ShaderAtomicOpCase).m_initialValue,needle,precision);
            poVar1 = (ostringstream *)(local_1b0 + 8);
            if (!bVar3) {
              local_1b0._0_8_ =
                   ((local_250->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"ERROR: at group ",0x10);
              std::ostream::operator<<(poVar1,(int)local_248);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", invocation ",0xd);
              std::ostream::operator<<(poVar1,(int)uVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,": found unexpected value ",0x19);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
              local_268.value = (deUint64)local_26c;
              tcu::Format::Hex<8UL>::toStream(&local_268,(ostream *)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              uVar5 = std::ios_base::~ios_base(local_138);
              local_258 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            }
          }
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_210,&local_26c);
          uVar6 = uVar6 + 1;
          iVar7 = local_234 + (int)tbs;
        } while (local_230 != uVar6);
      }
      this = local_250;
      bVar3 = containsAfterUintCast
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&local_210,(local_250->super_ShaderAtomicOpCase).m_initialValue,
                         (local_250->super_ShaderAtomicOpCase).m_precision);
      uVar6 = local_248;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      if (!bVar3) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: could not find initial value from group ",0x2f);
        std::ostream::operator<<(poVar1,(int)uVar6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        uVar5 = std::ios_base::~ios_base(local_138);
        local_258 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_210);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1e0);
      local_248 = uVar6 + 1;
      iVar7 = local_238 + local_23c;
      local_270 = local_270 + local_240;
    } while (local_248 != local_228);
    uVar4 = (uint)local_258 ^ 1;
  }
  return uVar4 & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;
		bool		anyError		= false;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<deInt32>	inValues;
			set<deUint32>	outValues;
			int				minValue		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deInt32 inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				inValues.insert(inputValue);
				minValue = de::min(inputValue, minValue);
			}

			if (!intEqualsAfterUintCast(minValue, groupOutput, m_precision))
			{
				m_testCtx.getLog()
					<< TestLog::Message
					<< "ERROR: at group " << groupNdx
					<< ": expected minimum " << minValue << " (" << tcu::Format::Hex<8>((deUint32)minValue) << ")"
					<< ", got " << groupOutput << " (" << tcu::Format::Hex<8>(groupOutput) << ")"
					<< TestLog::EndMessage;
				anyError = true;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!containsAfterUintCast(inValues, outputValue, m_precision) &&
					!intEqualsAfterUintCast((deInt32)m_initialValue, outputValue, m_precision))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
														   << " (" << tcu::Format::Hex<8>(outputValue) << ")"
									   << TestLog::EndMessage;
					anyError = true;
				}

				outValues.insert(outputValue);
			}

			if (!containsAfterUintCast(outValues, (int)m_initialValue, m_precision))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				anyError = true;
			}
		}

		return !anyError;
	}